

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O1

void duckdb::GlobFunction(ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  FunctionData *pFVar1;
  GlobalTableFunctionState *pGVar2;
  bool bVar3;
  MultiFileList *this;
  reference this_00;
  idx_t index;
  OpenFileInfo file;
  OpenFileInfo local_c0;
  string local_90;
  Value local_70;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  pFVar1 = (data_p->bind_data).ptr;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar2 = (data_p->global_state).ptr;
  index = 0;
  do {
    if (0x7ff < index) break;
    local_c0.path._M_dataplus._M_p = (pointer)&local_c0.path.field_2;
    local_c0.path._M_string_length = 0;
    local_c0.path.field_2._M_local_buf[0] = '\0';
    local_c0.extended_info.internal.
    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c0.extended_info.internal.
    super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = shared_ptr<duckdb::MultiFileList,_true>::operator->
                     ((shared_ptr<duckdb::MultiFileList,_true> *)(pFVar1 + 4));
    bVar3 = MultiFileList::Scan(this,(MultiFileListScanData *)(pGVar2 + 1),&local_c0);
    if (bVar3) {
      this_00 = vector<duckdb::Vector,_true>::operator[](&output->data,0);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_c0.path._M_dataplus._M_p,
                 local_c0.path._M_dataplus._M_p + local_c0.path._M_string_length);
      Value::Value(&local_70,&local_90);
      Vector::SetValue(this_00,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      index = index + 1;
    }
    if (local_c0.extended_info.internal.
        super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.extended_info.internal.
                 super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.path._M_dataplus._M_p != &local_c0.path.field_2) {
      operator_delete(local_c0.path._M_dataplus._M_p);
    }
  } while (bVar3);
  output->count = index;
  return;
}

Assistant:

static void GlobFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<GlobFunctionBindData>();
	auto &state = data_p.global_state->Cast<GlobFunctionState>();

	idx_t count = 0;
	while (count < STANDARD_VECTOR_SIZE) {
		OpenFileInfo file;
		if (!bind_data.file_list->Scan(state.file_list_scan, file)) {
			break;
		}
		output.data[0].SetValue(count++, file.path);
	}
	output.SetCardinality(count);
}